

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O1

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  pointer pIVar2;
  bool bVar3;
  uint uVar4;
  ExecutionModel EVar5;
  uint id;
  int32_t iVar6;
  MemoryModel MVar7;
  AddressingModel AVar8;
  Decoration DVar9;
  BuiltIn BVar10;
  ExecutionMode EVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var14;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *psVar15;
  _Base_ptr p_Var16;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar17;
  difference_type dVar18;
  _Base_ptr p_Var19;
  size_type sVar20;
  long lVar21;
  spv_result_t unaff_EBP;
  char *pcVar22;
  undefined1 *puVar23;
  size_t index;
  _Rb_tree_header *p_Var24;
  ulong uVar25;
  Instruction *i;
  pointer this;
  bool bVar26;
  bool bVar27;
  uint entry_point_id;
  spv_result_t local_258;
  string local_248;
  string local_228;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 < 0x10) {
    if (uVar1 == 0xe) {
      MVar7 = ValidationState_t::memory_model(_);
      if ((MVar7 == Vulkan) ||
         (bVar3 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar3)) {
        bVar3 = spvIsOpenCLEnv(_->context_->target_env);
        if (!bVar3) {
LAB_00201489:
          bVar3 = spvIsVulkanEnv(_->context_->target_env);
          unaff_EBP = SPV_SUCCESS;
          if (((!bVar3) || (AVar8 = ValidationState_t::addressing_model(_), AVar8 == Logical)) ||
             (AVar8 = ValidationState_t::addressing_model(_), unaff_EBP = SPV_SUCCESS,
             AVar8 == PhysicalStorageBuffer64)) goto LAB_00201b1d;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x121b,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                      local_248._M_dataplus._M_p._0_4_),local_248._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "Addressing model must be Logical or PhysicalStorageBuffer64 ",0x3c);
          pcVar22 = "in the Vulkan environment.";
          lVar21 = 0x1a;
          goto LAB_0020157a;
        }
        AVar8 = ValidationState_t::addressing_model(_);
        if ((AVar8 == Physical32) ||
           (AVar8 = ValidationState_t::addressing_model(_), AVar8 == Physical64)) {
          MVar7 = ValidationState_t::memory_model(_);
          if (MVar7 == OpenCL) goto LAB_00201489;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar22 = "Memory model must be OpenCL in the OpenCL environment.";
          lVar21 = 0x36;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Addressing model must be Physical32 or Physical64 ",0x32)
          ;
          pcVar22 = "in the OpenCL environment.";
          lVar21 = 0x1a;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = 
        "VulkanMemoryModelKHR capability must only be specified if the VulkanKHR memory model is used."
        ;
        lVar21 = 0x5d;
      }
      goto LAB_00201b06;
    }
    if (uVar1 != 0xf) goto LAB_00201b21;
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar12 = ValidationState_t::FindDef(_,uVar4);
    if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x36)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_248,_,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_)
                 ,local_248._M_string_length);
      pcVar22 = " is not a function.";
      lVar21 = 0x13;
      goto LAB_0020157a;
    }
    EVar5 = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
    if (EVar5 != ExecutionModelKernel) {
      id = Instruction::GetOperandAs<unsigned_int>(pIVar12,3);
      pIVar13 = ValidationState_t::FindDef(_,id);
      if ((pIVar13 == (Instruction *)0x0) ||
         ((long)(pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != 0xc)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x1219,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                    local_248._M_dataplus._M_p._0_4_),local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
        ValidationState_t::getIdName_abi_cxx11_(&local_228,_,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                    (uint)local_228._M_dataplus._M_p),local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"s function parameter count is not zero.",0x27);
        unaff_EBP = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p) !=
            &local_228.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p
                                  ),local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_) !=
            &local_248.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_
                                  ),local_248.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar3 = false;
      }
      else {
        bVar3 = true;
      }
      if (!bVar3) goto LAB_00201b1d;
    }
    pIVar12 = ValidationState_t::FindDef(_,(pIVar12->inst_).type_id);
    if ((pIVar12 != (Instruction *)0x0) && ((pIVar12->inst_).opcode == 0x13)) {
      psVar15 = ValidationState_t::GetExecutionModes(_,uVar4);
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (bVar3) {
        if ((int)EVar5 < 4) {
          if (EVar5 - ExecutionModelTessellationControl < 2) {
            if (psVar15 !=
                (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
              p_Var19 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var24 = &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                uVar25 = 0;
                p_Var16 = p_Var19;
                do {
                  uVar25 = uVar25 + (p_Var16[1]._M_color - _S_black < 3);
                  p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                } while ((_Rb_tree_header *)p_Var16 != p_Var24);
                if (1 < uVar25) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar22 = 
                  "Tessellation execution model entry points can specify at most one of SpacingEqual, SpacingFractionalOdd or SpacingFractionalEven execution modes."
                  ;
                  lVar21 = 0x91;
                  goto LAB_00201b06;
                }
                if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                  uVar25 = 0;
                  p_Var16 = p_Var19;
                  do {
                    uVar4 = p_Var16[1]._M_color - 0x16;
                    if (uVar4 < 4) {
                      lVar21 = *(long *)(&DAT_00269a60 + (ulong)uVar4 * 8);
                    }
                    else {
                      lVar21 = 0;
                    }
                    uVar25 = uVar25 + lVar21;
                    p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                  } while ((_Rb_tree_header *)p_Var16 != p_Var24);
                  if (1 < uVar25) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar22 = 
                    "Tessellation execution model entry points can specify at most one of Triangles, Quads or Isolines execution modes."
                    ;
                    lVar21 = 0x72;
                    goto LAB_00201b06;
                  }
                  if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                    uVar25 = 0;
                    do {
                      uVar25 = uVar25 + ((p_Var19[1]._M_color & ~_S_black) == 4);
                      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
                    } while ((_Rb_tree_header *)p_Var19 != p_Var24);
                    if (1 < uVar25) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar22 = 
                      "Tessellation execution model entry points can specify at most one of VertexOrderCw or VertexOrderCcw execution modes."
                      ;
                      lVar21 = 0x75;
                      goto LAB_00201b06;
                    }
                  }
                }
              }
            }
          }
          else if (EVar5 == ExecutionModelGeometry) {
            if (psVar15 !=
                (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
              p_Var19 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var24 = &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                lVar21 = 0;
                p_Var16 = p_Var19;
                do {
                  lVar21 = lVar21 + (ulong)(p_Var16[1]._M_color - 0x13 < 5);
                  p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                } while ((_Rb_tree_header *)p_Var16 != p_Var24);
                if (lVar21 == 1) {
                  if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                    lVar21 = 0;
                    do {
                      lVar21 = lVar21 + (ulong)(p_Var19[1]._M_color - 0x1b < 3);
                      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
                    } while ((_Rb_tree_header *)p_Var19 != p_Var24);
                    if (lVar21 == 1) goto LAB_002024db;
                  }
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar22 = 
                  "Geometry execution model entry points must specify exactly one of OutputPoints, OutputLineStrip or OutputTriangleStrip execution modes."
                  ;
                  lVar21 = 0x87;
                  goto LAB_00201b06;
                }
              }
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar22 = 
            "Geometry execution model entry points must specify exactly one of InputPoints, InputLines, InputLinesAdjacency, Triangles or InputTrianglesAdjacency execution modes."
            ;
            lVar21 = 0xa5;
            goto LAB_00201b06;
          }
        }
        else {
          if (EVar5 == ExecutionModelMeshEXT) {
            if (psVar15 !=
                (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
              p_Var19 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var24 = &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
              dVar18 = std::
                       count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                                 (p_Var19,p_Var24);
              if (dVar18 == 1) {
                dVar18 = std::
                         count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__10>
                                   (p_Var19,p_Var24);
                if (dVar18 != 2) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar22 = 
                  "MeshEXT execution model entry points must specify both OutputPrimitivesEXT and OutputVertices Execution Modes."
                  ;
                  lVar21 = 0x6e;
                  goto LAB_00201b06;
                }
                goto LAB_002024db;
              }
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar22 = 
            "MeshEXT execution model entry points must specify exactly one of OutputPoints, OutputLinesEXT, or OutputTrianglesEXT Execution Modes."
            ;
            lVar21 = 0x85;
            goto LAB_00201b06;
          }
          if (EVar5 != ExecutionModelFragment) goto LAB_002024db;
          if (psVar15 !=
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
            local_208._0_4_ = 7;
            sVar20 = std::
                     set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     ::count(psVar15,(key_type *)local_208);
            if (sVar20 != 0) {
              local_248._M_dataplus._M_p._0_4_ = 8;
              sVar20 = std::
                       set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                       ::count(psVar15,(key_type *)&local_248);
              if (sVar20 != 0) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar22 = 
                "Fragment execution model entry points can only specify one of OriginUpperLeft or OriginLowerLeft execution modes."
                ;
                lVar21 = 0x71;
                goto LAB_00201b06;
              }
            }
          }
          if (psVar15 ==
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
LAB_0020227c:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar22 = 
            "Fragment execution model entry points require either an OriginUpperLeft or OriginLowerLeft execution mode."
            ;
            lVar21 = 0x6a;
            goto LAB_00201b06;
          }
          local_208._0_4_ = 7;
          sVar20 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar15,(key_type *)local_208);
          if (sVar20 == 0) {
            local_248._M_dataplus._M_p._0_4_ = 8;
            sVar20 = std::
                     set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     ::count(psVar15,(key_type *)&local_248);
            if (sVar20 == 0) goto LAB_0020227c;
          }
          p_Var19 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var24 = &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var19 != p_Var24) {
            uVar25 = 0;
            p_Var16 = p_Var19;
            do {
              uVar25 = uVar25 + (p_Var16[1]._M_color - 0xe < 3);
              p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
            } while ((_Rb_tree_header *)p_Var16 != p_Var24);
            if (1 < uVar25) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar22 = 
              "Fragment execution model entry points can specify at most one of DepthGreater, DepthLess or DepthUnchanged execution modes."
              ;
              lVar21 = 0x7b;
              goto LAB_00201b06;
            }
            if ((_Rb_tree_header *)p_Var19 != p_Var24) {
              uVar25 = 0;
              p_Var16 = p_Var19;
              do {
                uVar25 = uVar25 + (p_Var16[1]._M_color - 0x14f6 < 6);
                p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
              } while ((_Rb_tree_header *)p_Var16 != p_Var24);
              if (1 < uVar25) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar22 = 
                "Fragment execution model entry points can specify at most one fragment shader interlock execution mode."
                ;
                lVar21 = 0x67;
                goto LAB_00201b06;
              }
              if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                uVar25 = 0;
                p_Var16 = p_Var19;
                do {
                  uVar25 = uVar25 + (p_Var16[1]._M_color - 0x13d7 < 3);
                  p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                } while ((_Rb_tree_header *)p_Var16 != p_Var24);
                if (1 < uVar25) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar22 = 
                  "Fragment execution model entry points can specify at most one of StencilRefUnchangedFrontAMD, StencilRefLessFrontAMD or StencilRefGreaterFrontAMD execution modes."
                  ;
                  lVar21 = 0xa2;
                  goto LAB_00201b06;
                }
                if ((_Rb_tree_header *)p_Var19 != p_Var24) {
                  uVar25 = 0;
                  do {
                    uVar25 = uVar25 + (p_Var19[1]._M_color - 0x13da < 3);
                    p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
                  } while ((_Rb_tree_header *)p_Var19 != p_Var24);
                  if (1 < uVar25) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar22 = 
                    "Fragment execution model entry points can specify at most one of StencilRefUnchangedBackAMD, StencilRefLessBackAMD or StencilRefGreaterBackAMD execution modes."
                    ;
                    lVar21 = 0x9f;
                    goto LAB_00201b06;
                  }
                }
              }
            }
          }
        }
      }
LAB_002024db:
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      if ((EVar5 == ExecutionModelGLCompute) && (bVar3)) {
        if (psVar15 !=
            (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
             *)0x0) {
          local_208._0_4_ = 0x11;
          sVar20 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar15,(key_type *)local_208);
          if (sVar20 != 0) goto LAB_00202657;
        }
        this = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (_->ordered_instructions_).
                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this == pIVar2) {
          bVar3 = false;
        }
        else {
          bVar26 = false;
          do {
            if ((((this->inst_).opcode == 0x47) &&
                (0x20 < (ulong)((long)(this->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start))) &&
               (DVar9 = Instruction::GetOperandAs<spv::Decoration>(this,1), DVar9 == BuiltIn)) {
              BVar10 = Instruction::GetOperandAs<spv::BuiltIn>(this,2);
              bVar27 = true;
              bVar3 = true;
              if (BVar10 != BuiltInWorkgroupSize) goto LAB_0020257d;
            }
            else {
LAB_0020257d:
              bVar3 = bVar26;
              if ((this->inst_).opcode == 0x14b) {
                EVar11 = Instruction::GetOperandAs<spv::ExecutionMode>(this,1);
                bVar27 = EVar11 == ExecutionModeLocalSizeId;
                if (bVar27) {
                  bVar3 = true;
                }
              }
              else {
                bVar27 = false;
              }
            }
          } while ((!bVar27) && (this = this + 1, bVar26 = bVar3, this != pIVar2));
        }
        if (!bVar3) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x191a,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                      local_248._M_dataplus._M_p._0_4_),local_248._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "In the Vulkan environment, GLCompute execution model entry points require either the LocalSize or LocalSizeId execution mode or an object decorated with WorkgroupSize must be specified."
                     ,0xb9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_) !=
              &local_248.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                     local_248._M_dataplus._M_p._0_4_),
                            local_248.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          unaff_EBP = local_38;
        }
        if (!bVar3) goto LAB_00201b1d;
      }
LAB_00202657:
      unaff_EBP = SPV_SUCCESS;
      goto LAB_00201b1d;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x1219,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_),
               local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
    ValidationState_t::getIdName_abi_cxx11_(&local_228,_,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p),
               local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"s function return type is not void.",0x23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p) !=
        &local_228.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p),
                      local_228.field_2._M_allocated_capacity + 1);
    }
    puVar23 = (undefined1 *)
              CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_);
    goto LAB_00201591;
  }
  if ((uVar1 != 0x10) && (uVar1 != 0x14b)) goto LAB_00201b21;
  local_228._M_dataplus._M_p._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  _Var14 = std::
           __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                     ((_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (_Var14._M_current ==
      (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"OpExecutionMode Entry Point <id> ",0x21);
    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(uint)local_228._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_),
               local_248._M_string_length);
    pcVar22 = " is not the Entry Point operand of an OpEntryPoint.";
    lVar21 = 0x33;
    goto LAB_0020157a;
  }
  EVar11 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
  if ((inst->inst_).opcode == 0x14b) {
    if (((EVar11 - ExecutionModeSubgroupsPerWorkgroupId < 3) ||
        (EVar11 == ExecutionModeFPFastMathDefault)) ||
       (EVar11 == ExecutionModeMaximumRegistersIdINTEL)) {
      uVar25 = (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      bVar3 = uVar25 < 3;
      unaff_EBP = local_258;
      if (!bVar3) {
        index = 2;
        do {
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,index);
          pIVar12 = ValidationState_t::FindDef(_,uVar4);
          bVar3 = true;
          if (EVar11 - ExecutionModeSubgroupsPerWorkgroupId < 3) {
            iVar6 = spvOpcodeIsConstant((uint)(pIVar12->inst_).opcode);
            if (iVar6 == 0) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              lVar21 = 0x4a;
              pcVar22 = "For OpExecutionModeId all Extra Operand ids must be constant instructions."
              ;
              goto LAB_0020130c;
            }
          }
          else if (EVar11 == ExecutionModeFPFastMathDefault) {
            if (index == 2) {
              bVar26 = ValidationState_t::IsFloatScalarType(_,uVar4);
              if (bVar26) goto LAB_00201326;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              lVar21 = 0x3c;
              pcVar22 = "The Target Type operand must be a floating-point scalar type";
            }
            else {
              ValidationState_t::EvalInt32IfConst
                        ((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar4);
              if ((local_203 == '\x01') && (local_208[4] != false)) {
                if ((uint)local_208._0_4_ < 0x80000) {
                  if ((local_208._0_4_ & 0x10) == 0) {
                    if ((~local_208._0_4_ & 0x30000) == 0 || (uint)local_208._0_4_ < 0x40000)
                    goto LAB_00201326;
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                    lVar21 = 0x6a;
                    pcVar22 = 
                    "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
                    ;
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                    lVar21 = 0x33;
                    pcVar22 = "The Fast Math Default operand must not include Fast";
                  }
                }
                else {
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  lVar21 = 0x39;
                  pcVar22 = "The Fast Math Default operand is an invalid bitmask value";
                }
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                lVar21 = 0x43;
                pcVar22 = "The Fast Math Default operand must be a non-specialization constant";
              }
            }
LAB_0020130c:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar22,lVar21);
            unaff_EBP = local_38;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar3 = false;
          }
LAB_00201326:
        } while ((bVar3) && (lVar21 = (3 - uVar25) + index, index = index + 1, lVar21 != 2));
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
                 ,0x7a);
      unaff_EBP = local_38;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      bVar3 = false;
    }
    if (bVar3) goto LAB_002018df;
    goto LAB_00201b1d;
  }
  if ((EVar11 - ExecutionModeSubgroupsPerWorkgroupId < 3) ||
     (EVar11 == ExecutionModeFPFastMathDefault)) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = 
    "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
    ;
    lVar21 = 0x98;
    goto LAB_00201b06;
  }
LAB_002018df:
  psVar17 = ValidationState_t::GetExecutionModels(_,(uint)local_228._M_dataplus._M_p);
  if (0x13d6 < (int)EVar11) {
    if ((int)EVar11 < 0x1495) {
      if (5 < EVar11 - ExecutionModeStencilRefUnchangedFrontAMD) {
        if (EVar11 == ExecutionModeQuadDerivativesKHR) {
          p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var24 = &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
          while (((_Rb_tree_header *)p_Var19 != p_Var24 && ((p_Var19[1]._M_color & ~_S_black) == 4))
                ) {
            p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
          }
          if ((_Rb_tree_header *)p_Var19 != p_Var24) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar22 = 
            "Execution mode can only be used with the Fragment or GLCompute execution model.";
            lVar21 = 0x4f;
            goto LAB_00201b06;
          }
        }
        else if (EVar11 == ExecutionModeRequireFullQuadsKHR) goto switchD_00201912_caseD_6;
        goto switchD_00201912_caseD_b;
      }
    }
    else if (5 < EVar11 - ExecutionModePixelInterlockOrderedEXT) {
      if (((EVar11 - ExecutionModeOutputLinesEXT < 0x1e) &&
          ((0x20000003U >> (EVar11 - ExecutionModeOutputLinesEXT & 0x1f) & 1) != 0)) &&
         (bVar3 = std::
                  all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__5>
                            ((psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                             &(psVar17->_M_t)._M_impl.super__Rb_tree_header), !bVar3)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Execution mode can only be used with the MeshEXT or MeshNV execution model.";
LAB_002019b2:
        lVar21 = 0x4b;
        goto LAB_00201b06;
      }
      goto switchD_00201912_caseD_b;
    }
switchD_00201912_caseD_6:
    p_Var24 = &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
    for (p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)p_Var19 != p_Var24 && (p_Var19[1]._M_color == 4));
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
    }
    if ((_Rb_tree_header *)p_Var19 == p_Var24) goto switchD_00201912_caseD_b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Execution mode can only be used with the Fragment execution model.";
LAB_00201b01:
    lVar21 = 0x42;
    goto LAB_00201b06;
  }
  switch(EVar11) {
  case ExecutionModeInvocations:
  case ExecutionModeInputPoints:
  case ExecutionModeInputLines:
  case ExecutionModeInputLinesAdjacency:
  case ExecutionModeInputTrianglesAdjacency:
  case ExecutionModeOutputLineStrip:
  case ExecutionModeOutputTriangleStrip:
    p_Var24 = &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
    for (p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)p_Var19 != p_Var24 && (p_Var19[1]._M_color == 3));
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
    }
    if ((_Rb_tree_header *)p_Var19 == p_Var24) goto switchD_00201912_caseD_b;
LAB_00201a94:
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Execution mode can only be used with the Geometry execution model.";
    goto LAB_00201b01;
  case ExecutionModeSpacingEqual:
  case ExecutionModeSpacingFractionalEven:
  case ExecutionModeSpacingFractionalOdd:
  case ExecutionModeVertexOrderCw:
  case ExecutionModeVertexOrderCcw:
  case ExecutionModePointMode:
  case ExecutionModeQuads:
  case ExecutionModeIsolines:
    p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var24 = &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
    while (((_Rb_tree_header *)p_Var19 != p_Var24 && (0xfffffffd < p_Var19[1]._M_color - 3))) {
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    }
    if ((_Rb_tree_header *)p_Var19 == p_Var24) goto switchD_00201912_caseD_b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Execution mode can only be used with a tessellation execution model.";
    lVar21 = 0x44;
    break;
  case ExecutionModePixelCenterInteger:
  case ExecutionModeOriginUpperLeft:
  case ExecutionModeOriginLowerLeft:
  case EarlyFragmentTests:
  case DepthReplacing:
  case DepthGreater:
  case DepthLess:
  case DepthUnchanged:
    goto switchD_00201912_caseD_6;
  case ExecutionModeXfb:
  case DepthReplacing|ExecutionModeSpacingEqual:
  case 0x20:
  case ExecutionModeInitializer:
  case ExecutionModeFinalizer:
  case ExecutionModeSubgroupSize:
  case ExecutionModeSubgroupsPerWorkgroup:
  case ExecutionModeSubgroupsPerWorkgroupId:
    goto switchD_00201912_caseD_b;
  case ExecutionModeLocalSize:
  case ExecutionModeLocalSizeId:
    if (((EVar11 == ExecutionModeLocalSizeId) && ((_->features_).env_allow_localsizeid == false)) &&
       (_->options_->allow_localsizeid == false)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = "LocalSizeId mode is not allowed by the current environment.";
      lVar21 = 0x3b;
    }
    else {
      bVar3 = std::
              all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                        ((psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<spv::ExecutionModel>)
                         &(psVar17->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
      if (bVar3) goto switchD_00201912_caseD_b;
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
      if ((!bVar3) &&
         (bVar3 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityMeshShadingEXT), !bVar3)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = "Execution mode can only be used with a Kernel or GLCompute execution model.";
        goto LAB_002019b2;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar22 = 
      "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
      ;
      lVar21 = 0x6d;
    }
    break;
  case ExecutionModeLocalSizeHint:
  case ExecutionModeVecTypeHint:
  case ContractionOff:
  case ExecutionModeLocalSizeHintId:
    p_Var24 = &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
    for (p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)p_Var19 != p_Var24 && (p_Var19[1]._M_color == 6));
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
    }
    if ((_Rb_tree_header *)p_Var19 == p_Var24) goto switchD_00201912_caseD_b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Execution mode can only be used with the Kernel execution model.";
    lVar21 = 0x40;
    break;
  case ExecutionModeTriangles:
    p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var24 = &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
    while (((_Rb_tree_header *)p_Var19 != p_Var24 && (0xfffffffc < p_Var19[1]._M_color - 4))) {
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    }
    if ((_Rb_tree_header *)p_Var19 == p_Var24) goto switchD_00201912_caseD_b;
LAB_00201ec8:
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Execution mode can only be used with a Geometry or tessellation execution model.";
    lVar21 = 0x50;
    break;
  case ExecutionModeOutputVertices:
    bVar3 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__4>
                      ((psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spv::ExecutionModel>)
                       &(psVar17->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
    if (bVar3) goto switchD_00201912_caseD_b;
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
    if ((!bVar3) &&
       (bVar3 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityMeshShadingEXT), !bVar3))
    goto LAB_00201ec8;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = 
    "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
    ;
    lVar21 = 0x61;
    break;
  case ExecutionModeOutputPoints:
    bVar3 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1>
                      ((psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spv::ExecutionModel>)
                       &(psVar17->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
    if (bVar3) goto switchD_00201912_caseD_b;
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
    if ((!bVar3) &&
       (bVar3 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityMeshShadingEXT), !bVar3))
    goto LAB_00201a94;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar22 = "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model."
    ;
    lVar21 = 0x54;
    break;
  default:
    if ((EVar11 - ExecutionModeNonCoherentColorAttachmentReadEXT < 3) ||
       (EVar11 == EarlyAndLateFragmentTestsAMD)) goto switchD_00201912_caseD_6;
switchD_00201912_caseD_b:
    if (EVar11 != ExecutionModeFPFastMathDefault) {
LAB_00201fda:
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      unaff_EBP = SPV_SUCCESS;
      if (!bVar3) goto LAB_00201b1d;
      if (EVar11 == ExecutionModePixelCenterInteger) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x122e,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                    local_248._M_dataplus._M_p._0_4_),local_248._M_string_length);
        pcVar22 = 
        "In the Vulkan environment, the PixelCenterInteger execution mode must not be used.";
        lVar21 = 0x52;
      }
      else {
        if (EVar11 != ExecutionModeOriginLowerLeft) goto LAB_00201b1d;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x122d,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                    local_248._M_dataplus._M_p._0_4_),local_248._M_string_length);
        pcVar22 = "In the Vulkan environment, the OriginLowerLeft execution mode must not be used.";
        lVar21 = 0x4f;
      }
LAB_0020157a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar22,lVar21);
      puVar23 = (undefined1 *)
                CONCAT44(local_248._M_dataplus._M_p._4_4_,local_248._M_dataplus._M_p._0_4_);
LAB_00201591:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23 != &local_248.field_2) {
        operator_delete(puVar23,local_248.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00201b18;
    }
    psVar15 = ValidationState_t::GetExecutionModes(_,(uint)local_228._M_dataplus._M_p);
    bVar3 = true;
    if (psVar15 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      p_Var24 = &(psVar15->_M_t)._M_impl.super__Rb_tree_header;
      p_Var19 = (psVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var16 = &p_Var24->_M_header;
      for (; p_Var19 != (_Base_ptr)0x0; p_Var19 = (&p_Var19->_M_left)[bVar26]) {
        bVar26 = p_Var19[1]._M_color < 0x1f;
        if (!bVar26) {
          p_Var16 = p_Var19;
        }
      }
      p_Var19 = &p_Var24->_M_header;
      if (((_Rb_tree_header *)p_Var16 != p_Var24) && (p_Var19 = p_Var16, 0x1f < p_Var16[1]._M_color)
         ) {
        p_Var19 = &p_Var24->_M_header;
      }
      if ((_Rb_tree_header *)p_Var19 == p_Var24) {
        local_208._0_4_ = 0x116d;
        sVar20 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count(psVar15,(key_type *)local_208);
        if (sVar20 == 0) goto LAB_00201fcf;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = 
        "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
        ;
        lVar21 = 0x68;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar22 = 
        "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
        ;
        lVar21 = 0x5e;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar22,lVar21);
      unaff_EBP = local_38;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      bVar3 = false;
    }
LAB_00201fcf:
    if (bVar3) goto LAB_00201fda;
    goto LAB_00201b1d;
  }
LAB_00201b06:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar22,lVar21);
LAB_00201b18:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  unaff_EBP = local_38;
LAB_00201b1d:
  if (unaff_EBP == SPV_SUCCESS) {
LAB_00201b21:
    unaff_EBP = SPV_SUCCESS;
  }
  return unaff_EBP;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}